

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O2

int32_t WebRtcIsac_GetDownlinkBandwidth(BwEstimatorstr *bwest_str)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  float fVar4;
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    fVar4 = bwest_str->rec_jitter_short_term / bwest_str->rec_jitter_short_term_abs;
    iVar1 = (int)((float)bwest_str->rec_bw * (1.0 - (fVar4 * 0.15 * fVar4 + 0.15) * fVar4));
    iVar3 = 56000;
    if (iVar1 < 56000) {
      iVar3 = iVar1;
    }
    iVar2 = 10000;
    if (10000 < iVar3) {
      iVar2 = iVar3;
    }
    return iVar2;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x2ca,"int32_t WebRtcIsac_GetDownlinkBandwidth(const BwEstimatorstr *)");
}

Assistant:

int32_t WebRtcIsac_GetDownlinkBandwidth( const BwEstimatorstr *bwest_str)
{
  int32_t  rec_bw;
  float   jitter_sign;
  float   bw_adjust;

  assert(!bwest_str->external_bw_info.in_use);

  /* create a value between -1.0 and 1.0 indicating "average sign" of jitter */
  jitter_sign = bwest_str->rec_jitter_short_term /
      bwest_str->rec_jitter_short_term_abs;

  /* adjust bw proportionally to negative average jitter sign */
  bw_adjust = 1.0f - jitter_sign * (0.15f + 0.15f * jitter_sign * jitter_sign);

  /* adjust Rate if jitter sign is mostly constant */
  rec_bw = (int32_t)(bwest_str->rec_bw * bw_adjust);

  /* limit range of bottle neck rate */
  if (rec_bw < MIN_ISAC_BW)
  {
    rec_bw = MIN_ISAC_BW;
  }
  else if (rec_bw > MAX_ISAC_BW)
  {
    rec_bw = MAX_ISAC_BW;
  }
  return rec_bw;
}